

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFetc.cpp
# Opt level: O0

void __thiscall NaPNFetcher::set_sum_weights(NaPNFetcher *this,NaReal *pfWeights)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  long in_RSI;
  long in_RDI;
  int i;
  undefined4 local_14;
  
  NaPetriNode::check_tunable((NaPetriNode *)0x14d55d);
  if (*(int *)(in_RDI + 0x120) < 0) {
    if (*(void **)(in_RDI + 0x118) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x118));
    }
    *(undefined8 *)(in_RDI + 0x118) = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*(int *)(in_RDI + 0x120);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    *(void **)(in_RDI + 0x118) = pvVar3;
    if (in_RSI == 0) {
      for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x120); local_14 = local_14 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x118) + (long)local_14 * 8) = 0x3ff0000000000000;
      }
    }
    else {
      for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x120); local_14 = local_14 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x118) + (long)local_14 * 8) =
             *(undefined8 *)(in_RSI + (long)local_14 * 8);
      }
    }
  }
  return;
}

Assistant:

void
NaPNFetcher::set_sum_weights (const NaReal* pfWeights)
{
  check_tunable();

  if(nOutDim < 0)
    {
      delete[] pfSumWeights;
      pfSumWeights = NULL;
    }
  else
    {
      int	i;
      pfSumWeights = new NaReal[nOutDim];
      if(NULL == pfWeights)
	for(i = 0; i < nOutDim; ++i)
	  pfSumWeights[i] = 1.0;
      else
	for(i = 0; i < nOutDim; ++i)
	  pfSumWeights[i] = pfWeights[i];
    }
}